

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_task.cpp
# Opt level: O3

MPP_RET mpp_task_meta_get_ptr(MppTask task,MppMetaKey key,void **val,void *default_val)

{
  MPP_RET MVar1;
  MPP_RET MVar2;
  
  MVar1 = check_mpp_task_name(task);
  MVar2 = MPP_NOK;
  if (MVar1 == MPP_OK) {
    MVar2 = mpp_meta_get_ptr(*(MppMeta *)((long)task + 0x28),key,val);
    if (MVar2 == MPP_OK) {
      MVar2 = MPP_OK;
    }
    else {
      *val = default_val;
    }
  }
  return MVar2;
}

Assistant:

MPP_RET mpp_task_meta_get_ptr(MppTask task, MppMetaKey key, void  **val, void *default_val)
{
    if (check_mpp_task_name(task))
        return MPP_NOK;

    MppTaskImpl *impl = (MppTaskImpl *)task;
    MPP_RET ret = mpp_meta_get_ptr(impl->meta, key, val);
    if (ret)
        *val = default_val;
    return ret;
}